

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.cpp
# Opt level: O0

void __thiscall ArmPoolCommand::writeSymData(ArmPoolCommand *this,SymbolData *symData)

{
  int64_t iVar1;
  SymbolData *pSVar2;
  size_type sVar3;
  allocator<char> local_39;
  string local_38;
  SymbolData *local_18;
  SymbolData *symData_local;
  ArmPoolCommand *this_local;
  
  local_18 = symData;
  symData_local = (SymbolData *)this;
  sVar3 = std::vector<int,_std::allocator<int>_>::size(&this->values);
  pSVar2 = local_18;
  if (sVar3 != 0) {
    iVar1 = this->position;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,".pool",&local_39);
    SymbolData::addLabel(pSVar2,iVar1,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    pSVar2 = local_18;
    iVar1 = this->position;
    sVar3 = std::vector<int,_std::allocator<int>_>::size(&this->values);
    SymbolData::addData(pSVar2,iVar1,sVar3 << 2,Data32);
  }
  return;
}

Assistant:

void ArmPoolCommand::writeSymData(SymbolData& symData) const
{
	if (values.size() != 0)
	{
		symData.addLabel(position, ".pool");
		symData.addData(position,values.size()*4,SymbolData::Data32);
	}
}